

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O3

back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_> __thiscall
duckdb_fmt::v6::
basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>::
format<duckdb_fmt::v6::printf_arg_formatter<duckdb_fmt::v6::buffer_range<char>>>
          (basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>
           *this)

{
  type *ptVar1;
  byte bVar2;
  type *__last;
  byte bVar3;
  int arg_index;
  int iVar4;
  back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_> bVar5;
  InvalidInputException *this_00;
  undefined8 uVar6;
  undefined1 uVar7;
  uint uVar8;
  undefined1 type;
  uint uVar9;
  type *ptVar10;
  type *end;
  char *it;
  format_arg arg;
  error_handler eh;
  type *local_c0;
  anon_union_16_15_055d57a1_for_value<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_1
  local_b8;
  type local_a8 [7];
  format_specs local_8c;
  undefined1 local_78 [24];
  context_type *local_60;
  basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>
  *local_58;
  type *local_50;
  long local_48;
  type local_40 [4];
  
  bVar5.container = *(buffer<char> **)this;
  local_c0 = *(type **)(this + 0x18);
  ptVar10 = local_c0;
  if (*(long *)(this + 0x20) != 0) {
    local_58 = this + 0x18;
    end = (type *)((long)local_c0 + *(long *)(this + 0x20));
    do {
      ptVar1 = (type *)((long)local_c0 + 1);
      if ((char)*local_c0 == 0x25) {
        if ((ptVar1 == end) || (*(undefined1 *)ptVar1 != 0x25)) {
          __last = local_c0;
          local_c0 = ptVar1;
          bVar5 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                  __copy_m<char_const*,std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>>
                            ((char *)ptVar10,(char *)__last,bVar5);
          local_8c.width = 0;
          local_8c.precision = -1;
          local_8c._8_2_ = 0x200;
          local_8c.fill.data_[4] = '\0';
          local_8c.fill.data_[5] = '\0';
          local_8c.fill.data_[0] = ' ';
          local_8c.fill.data_[1] = '\0';
          local_8c.fill.data_[2] = '\0';
          local_8c.fill.data_[3] = '\0';
          local_8c.thousands = '\0';
          arg_index = basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
                      ::parse_header((basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
                                      *)this,(char **)&local_c0,(char *)end,&local_8c);
          if (arg_index == 0) {
            local_50 = local_40;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_50,"argument index out of range","");
            this = (basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>
                    *)(local_78 + 0x10);
            local_78._0_8_ = this;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_78,local_50,(byte *)((long)local_50 + local_48));
            end = local_a8;
            local_b8.pointer = end;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b8,local_78._0_8_,local_78._8_8_ + local_78._0_8_);
            duckdb_fmt::v6::internal::error_handler::on_error(local_58,&local_b8);
LAB_0074c194:
            local_b8.pointer = local_a8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b8,"number is too big","");
            uVar6 = duckdb_fmt::v6::internal::error_handler::on_error(local_78,&local_b8);
            if (local_b8._0_8_ != end) {
              operator_delete(local_b8.pointer);
            }
            if ((basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>
                 *)local_78._0_8_ != this) {
              operator_delete((void *)local_78._0_8_);
            }
            if (local_50 != local_a8) {
              operator_delete(local_50);
            }
            _Unwind_Resume(uVar6);
          }
          bVar2 = 1;
          if ((local_c0 != end) && ((char)*local_c0 == 0x2e)) {
            ptVar10 = (type *)((long)local_c0 + 1);
            if (ptVar10 == end) {
LAB_0074be30:
              local_8c._0_8_ = local_8c._0_8_ & 0xffffffff;
              bVar2 = 0;
              local_c0 = ptVar10;
            }
            else {
              uVar7 = *(undefined1 *)ptVar10;
              uVar8 = (uint)(char)uVar7;
              if (uVar8 - 0x30 < 10) {
                if (uVar7 == 0x30) {
                  uVar9 = 0;
                  local_c0 = (type *)((long)local_c0 + 2);
                }
                else {
                  uVar9 = 0;
                  ptVar1 = (type *)((long)local_c0 + 2);
                  local_c0 = ptVar10;
                  do {
                    ptVar10 = ptVar1;
                    if (0xccccccc < uVar9) goto LAB_0074c194;
                    uVar9 = ((int)(char)uVar8 + uVar9 * 10) - 0x30;
                    local_c0 = ptVar10;
                    if (ptVar10 == end) break;
                    uVar8 = (uint)(byte)(char)*ptVar10;
                    ptVar1 = (type *)((long)ptVar10 + 1);
                  } while ((byte)((char)*ptVar10 - 0x30) < 10);
                  if ((int)uVar9 < 0) goto LAB_0074c194;
                }
                local_8c.precision = uVar9;
              }
              else {
                if (uVar7 != 0x2a) goto LAB_0074be30;
                local_c0 = (type *)((long)local_c0 + 2);
                basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
                ::get_arg((format_arg *)&local_b8.string,
                          (basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
                           *)this,-1);
                iVar4 = visit_format_arg<duckdb_fmt::v6::internal::printf_precision_handler,duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>
                                  ((printf_precision_handler *)local_78,
                                   (basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                                    *)&local_b8.string);
                local_8c.precision = iVar4;
              }
            }
          }
          basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
          ::get_arg((format_arg *)&local_b8.string,
                    (basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
                     *)this,arg_index);
          bVar3 = local_8c._9_1_;
          if ((short)local_8c._8_2_ < 0) {
            switch(local_a8[0]) {
            case int_type:
            case uint_type:
              if (local_b8.int_value == 0) {
LAB_0074bfae:
                bVar3 = local_8c._9_1_ & 0x7f;
                local_8c._8_2_ = local_8c._8_2_ & 0x7fff;
              }
              break;
            case long_long_type:
            case ulong_long_type:
              if (local_b8.long_long_value == 0) goto LAB_0074bfae;
              break;
            case bool_type:
            case char_type:
              if (local_b8.bool_value == false) goto LAB_0074bfae;
            }
          }
          if (local_8c.fill.data_[0] == '0') {
            if (local_a8[0] - named_arg_type < 0xc) {
              local_8c._8_2_ = CONCAT11(bVar3,local_8c.type) & 0xf0ff | 0x400;
            }
            else {
              local_8c.fill.data_[0] = ' ';
            }
          }
          if (local_c0 == end) {
            uVar7 = none_type;
          }
          else {
            uVar7 = (undefined1)*local_c0;
            local_c0 = (type *)((long)local_c0 + 1);
          }
          if (local_c0 == end) {
            type = none_type;
          }
          else {
            type = (undefined1)*local_c0;
          }
          if ((byte)uVar7 < 0x6c) {
            if (uVar7 != 0x4c) {
              if (uVar7 == 0x68) {
                if (type == 0x68) {
                  local_c0 = (type *)((long)local_c0 + 1);
                  if (local_c0 == end) {
                    uVar7 = none_type;
                  }
                  else {
                    uVar7 = *(undefined1 *)local_c0;
                  }
                  internal::
                  convert_arg<signed_char,duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>,char>
                            ((basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                              *)&local_b8.string,uVar7);
                }
                else {
                  internal::
                  convert_arg<short,duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>,char>
                            ((basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                              *)&local_b8.string,type);
                }
              }
              else {
                if (uVar7 == 0x6a) goto LAB_0074bf56;
LAB_0074bf68:
                local_c0 = (type *)((long)local_c0 + -1);
                internal::
                convert_arg<void,duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>,char>
                          ((basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                            *)&local_b8.string,uVar7);
              }
            }
          }
          else if (uVar7 == 0x6c) {
            if (type != 0x6c) goto LAB_0074bf56;
            local_c0 = (type *)((long)local_c0 + 1);
            if (local_c0 == end) {
              uVar7 = none_type;
            }
            else {
              uVar7 = *(undefined1 *)local_c0;
            }
            internal::
            convert_arg<long_long,duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>,char>
                      ((basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                        *)&local_b8.string,uVar7);
          }
          else if (uVar7 == 0x74) {
LAB_0074bf56:
            internal::
            convert_arg<long,duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>,char>
                      ((basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                        *)&local_b8.string,type);
          }
          else {
            if (uVar7 != 0x7a) goto LAB_0074bf68;
            internal::
            convert_arg<unsigned_long,duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>,char>
                      ((basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                        *)&local_b8.string,type);
          }
          uVar6 = local_b8.long_long_value;
          if (local_c0 == end) {
            this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_78._0_8_ = local_78 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_78,"invalid format string","");
            duckdb::InvalidInputException::InvalidInputException(this_00,(string *)local_78);
            __cxa_throw(this_00,&duckdb::InvalidInputException::typeinfo,
                        std::runtime_error::~runtime_error);
          }
          ptVar10 = (type *)((long)local_c0 + 1);
          uVar7 = (undefined1)*local_c0;
          local_8c.type = uVar7;
          if (local_a8[0] - named_arg_type < 9) {
            if (uVar7 != 99) {
              if ((uVar7 == 0x75) || (uVar7 == 0x69)) {
                local_8c.type = 'd';
                uVar7 = 100;
              }
              goto LAB_0074c02a;
            }
            switch(local_a8[0]) {
            case int_type:
            case uint_type:
            case long_long_type:
            case ulong_long_type:
            case bool_type:
            case char_type:
              local_b8.int_value._1_3_ = 0;
              local_b8.long_long_value._4_4_ = SUB84(uVar6,4);
              local_a8[0] = char_type;
            }
          }
          else {
LAB_0074c02a:
            if (!(bool)(bVar2 | uVar7 != 100)) {
              local_8c.thousands = '.';
            }
          }
          local_78._8_8_ = (void *)0x0;
          local_c0 = ptVar10;
          local_78._0_8_ = bVar5;
          local_78._16_8_ = &local_8c;
          local_60 = (context_type *)this;
          visit_format_arg<duckdb_fmt::v6::printf_arg_formatter<duckdb_fmt::v6::buffer_range<char>>,duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>
                    ((printf_arg_formatter<duckdb_fmt::v6::buffer_range<char>_> *)local_78,
                     (basic_format_arg<duckdb_fmt::v6::basic_printf_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                      *)&local_b8.string);
          ptVar1 = local_c0;
        }
        else {
          local_c0 = ptVar1;
          bVar5 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                  __copy_m<char_const*,std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>>
                            ((char *)ptVar10,(char *)ptVar1,bVar5);
          ptVar10 = (type *)((long)local_c0 + 1);
          ptVar1 = ptVar10;
        }
      }
      local_c0 = ptVar1;
    } while (local_c0 != end);
  }
  bVar5 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char_const*,std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>>
                    ((char *)ptVar10,(char *)local_c0,bVar5);
  return (back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>)bVar5.container;
}

Assistant:

OutputIt out() { return out_; }